

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxil.c
# Opt level: O2

void update_z(OSQPWorkspace *work)

{
  double dVar1;
  OSQPData *pOVar2;
  long lVar3;
  long lVar4;
  
  pOVar2 = work->data;
  lVar3 = pOVar2->m;
  for (lVar4 = 0; lVar4 < lVar3; lVar4 = lVar4 + 1) {
    dVar1 = work->settings->alpha;
    work->z[lVar4] =
         work->rho_inv_vec[lVar4] * work->y[lVar4] +
         dVar1 * work->xz_tilde[pOVar2->n + lVar4] + (1.0 - dVar1) * work->z_prev[lVar4];
  }
  project(work,work->z);
  return;
}

Assistant:

void update_z(OSQPWorkspace *work) {
  c_int i;

  // update z
  for (i = 0; i < work->data->m; i++) {
    work->z[i] = work->settings->alpha * work->xz_tilde[i + work->data->n] +
                 ((c_float)1.0 - work->settings->alpha) * work->z_prev[i] +
                 work->rho_inv_vec[i] * work->y[i];
  }

  // project z
  project(work, work->z);
}